

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O1

void okim6295_w(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  code *UNRECOVERED_JUMPTABLE;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  
  uVar5 = (uint)CONCAT71(in_register_00000031,offset);
  switch(CONCAT71(in_register_00000031,offset) & 0xffffffff) {
  case 0:
    if (*(short *)((long)chip + 0xe0) == -1) {
      if ((char)data < '\0') {
        *(ushort *)((long)chip + 0xe0) = (ushort)(data & 0x7f);
      }
      else {
        bVar1 = data >> 3;
        lVar4 = 0x38;
        do {
          if ((bVar1 & 1) != 0) {
            *(undefined1 *)((long)chip + lVar4) = 0;
          }
          bVar1 = bVar1 >> 1;
          lVar4 = lVar4 + 0x30;
        } while (lVar4 != 0xf8);
      }
    }
    else {
      uVar7 = (ulong)(data >> 4);
      pcVar10 = (char *)((long)chip + 0x38);
      uVar8 = 0;
      do {
        if (((uVar7 & 1) != 0) && (*pcVar10 == '\0')) {
          uVar9 = (uint)*(short *)((long)chip + 0xe0);
          bVar1 = memory_raw_read_byte((okim6295_state *)chip,uVar9 * 8);
          bVar2 = memory_raw_read_byte((okim6295_state *)chip,uVar9 * 8 + 1);
          bVar3 = memory_raw_read_byte((okim6295_state *)chip,uVar9 * 8 + 2);
          uVar11 = (bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
          bVar1 = memory_raw_read_byte((okim6295_state *)chip,uVar9 * 8 + 3);
          bVar2 = memory_raw_read_byte((okim6295_state *)chip,uVar9 * 8 + 4);
          bVar3 = memory_raw_read_byte((okim6295_state *)chip,uVar9 * 8 + 5);
          uVar5 = (bVar1 & 3) * 0x10000 + (uint)bVar2 * 0x100 | (uint)bVar3;
          iVar6 = uVar5 - uVar11;
          if (uVar5 < uVar11 || iVar6 == 0) {
            emu_logf((DEV_LOGGER *)((long)chip + 8),'\x04',
                     "Voice %u requested to play invalid sample %02x\n",uVar8 & 0xffffffff,
                     (ulong)uVar9);
            *pcVar10 = '\0';
          }
          else {
            *pcVar10 = '\x01';
            *(uint *)(pcVar10 + 4) = uVar11;
            pcVar10[8] = '\0';
            pcVar10[9] = '\0';
            pcVar10[10] = '\0';
            pcVar10[0xb] = '\0';
            *(int *)(pcVar10 + 0xc) = iVar6 * 2 + 2;
            oki_adpcm_reset((oki_adpcm_state *)(pcVar10 + -0x18));
            *(int *)(pcVar10 + 0x10) = volume_table[data & 0xf];
          }
        }
        uVar8 = uVar8 + 1;
        uVar7 = uVar7 >> 1;
        pcVar10 = pcVar10 + 0x30;
      } while (uVar8 != 4);
      *(undefined2 *)((long)chip + 0xe0) = 0xffff;
    }
    break;
  case 8:
  case 9:
  case 10:
    *(UINT8 *)((long)chip + (ulong)(uVar5 & 3) + 0xf4) = data;
    break;
  case 0xb:
    *(UINT8 *)((long)chip + 0xf7) = data;
    okim6295_set_clock(chip,0);
    UNRECOVERED_JUMPTABLE = *(code **)((long)chip + 0x108);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      data = *(UINT8 *)((long)chip + 0xe8);
LAB_001608a5:
      uVar5 = 0x84;
      if (data == '\0') {
        uVar5 = 0xa5;
      }
      (*UNRECOVERED_JUMPTABLE)
                (*(undefined8 *)((long)chip + 0x110),
                 (ulong)*(uint *)((long)chip + 0xf0) / (ulong)uVar5,
                 (ulong)*(uint *)((long)chip + 0xf0) % (ulong)uVar5);
      return;
    }
    break;
  case 0xc:
    *(UINT8 *)((long)chip + 0xe8) = data;
    UNRECOVERED_JUMPTABLE = *(code **)((long)chip + 0x108);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) goto LAB_001608a5;
    break;
  case 0xe:
    *(UINT8 *)((long)chip + 0xea) = data;
    break;
  case 0xf:
    *(uint *)((long)chip + 0xe4) = (uint)data << 0x12;
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    *(UINT8 *)((long)chip + (ulong)(uVar5 & 3) + 0xeb) = data;
  }
  return;
}

Assistant:

static void okim6295_w(void* chip, UINT8 offset, UINT8 data)
{
	okim6295_state *info = (okim6295_state *)chip;
	
	switch(offset)
	{
	case 0x00:
		okim6295_write_command(info, data);
		break;
	case 0x08:
	case 0x09:
	case 0x0A:
		info->clock_buffer[offset & 0x03] = data;
		break;
	case 0x0B:
		info->clock_buffer[offset & 0x03] = data;
		okim6295_set_clock(chip, 0);	// refresh clock from clock_buffer
		if (info->SmpRateFunc != NULL)
			info->SmpRateFunc(info->SmpRateData, okim6295_get_rate(chip));
		break;
	case 0x0C:
		okim6295_set_pin7(info, data);
		break;
	case 0x0E:	// NMK112 bank switch enable
		info->nmk_mode = data;
		break;
	case 0x0F:
		okim6295_set_bank_base(info, data << 18);
		break;
	case 0x10:
	case 0x11:
	case 0x12:
	case 0x13:
		info->nmk_bank[offset & 0x03] = data;
		break;
	}
	
	return;
}